

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

DuckTransaction * duckdb::DuckTransaction::Get(ClientContext *context,Catalog *catalog)

{
  int iVar1;
  AttachedDatabase *db;
  MetaTransaction *this;
  DuckTransaction *pDVar2;
  InternalException *this_00;
  string local_40;
  
  db = Catalog::GetAttached(catalog);
  this = TransactionContext::ActiveTransaction(&context->transaction);
  pDVar2 = (DuckTransaction *)MetaTransaction::GetTransaction(this,db);
  iVar1 = (*(pDVar2->super_Transaction)._vptr_Transaction[3])(pDVar2);
  if ((char)iVar1 != '\0') {
    return pDVar2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"DuckTransaction::Get called on non-DuckDB transaction","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DuckTransaction &DuckTransaction::Get(ClientContext &context, Catalog &catalog) {
	auto &transaction = Transaction::Get(context, catalog);
	if (!transaction.IsDuckTransaction()) {
		throw InternalException("DuckTransaction::Get called on non-DuckDB transaction");
	}
	return transaction.Cast<DuckTransaction>();
}